

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O1

uint Js::JavascriptArray::GetFromIndex<unsigned_int>
               (Var arg,uint length,ScriptContext *scriptContext,bool addWithLength)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  int64 iVar5;
  long lVar6;
  double dVar7;
  
  if (((ulong)arg & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)arg & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (((ulong)arg & 0xffff000000000000) == 0x1000000000000) {
    iVar5 = TaggedInt::ToInt64(arg);
    dVar7 = (double)iVar5;
  }
  else {
    dVar7 = JavascriptConversion::ToInteger_Full(arg,scriptContext);
  }
  if (0.0 <= dVar7) {
    if ((double)length <= dVar7) {
      dVar7 = (double)length;
    }
    uVar3 = (uint)(long)dVar7;
  }
  else {
    uVar3 = 0;
    if (addWithLength) {
      lVar6 = 0;
      if (0 < (long)(dVar7 + (double)length)) {
        lVar6 = (long)(dVar7 + (double)length);
      }
      uVar3 = (uint)lVar6;
    }
  }
  return uVar3;
}

Assistant:

static T GetFromIndex(Var arg, T length, ScriptContext *scriptContext, bool addWithLength = true)
        {
            T fromIndex = 0;

            double value = TaggedInt::Is(arg) ? (double)TaggedInt::ToInt64(arg) : JavascriptConversion::ToInteger(arg, scriptContext);

            if (value < 0)
            {
                fromIndex = addWithLength ? (T)max(0i64, (int64)(value + length)) : 0;
            }
            else
            {
                fromIndex = (T)min(value, (double)length);
            }
            return fromIndex;
        }